

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex.h
# Opt level: O1

void __thiscall
alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::merge
          (Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true> *this,
          data_node_type *leaf,int key)

{
  longlong *plVar1;
  TraversalNode *pTVar2;
  TraversalNode *pTVar3;
  int *piVar4;
  undefined1 auVar5 [16];
  uint8_t uVar6;
  byte bVar7;
  self_type *psVar8;
  AlexNode<int,_int> *pAVar9;
  undefined1 auVar10 [16];
  TraversalNode TVar11;
  TraversalNode TVar12;
  iterator iVar13;
  model_node_type *pmVar14;
  long lVar15;
  self_type **ppsVar16;
  AlexNode<int,_int> *pAVar17;
  uint uVar18;
  int iVar19;
  int iVar20;
  data_node_type *pdVar21;
  int iVar22;
  ulong uVar23;
  ulong uVar24;
  int iVar25;
  int iVar26;
  data_node_type *unaff_R12;
  data_node_type *pdVar27;
  Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true> *this_00;
  uint uVar28;
  model_node_type *node;
  AlexNode<int,_int> *node_00;
  bool bVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  vector<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode,_std::allocator<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode>_>
  traversal_path;
  void *local_78;
  iterator iStack_70;
  TraversalNode *local_68;
  TraversalNode local_60;
  int local_4c;
  double local_48;
  Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true> *local_40;
  double local_38;
  
  local_78 = (void *)0x0;
  iStack_70._M_current = (TraversalNode *)0x0;
  local_68 = (TraversalNode *)0x0;
  local_60.node = this->superroot_;
  local_60.bucketID = 0;
  local_4c = key;
  std::
  vector<alex::Alex<int,int,alex::AlexCompare,std::allocator<std::pair<int,int>>,true>::TraversalNode,std::allocator<alex::Alex<int,int,alex::AlexCompare,std::allocator<std::pair<int,int>>,true>::TraversalNode>>
  ::
  _M_realloc_insert<alex::Alex<int,int,alex::AlexCompare,std::allocator<std::pair<int,int>>,true>::TraversalNode>
            ((vector<alex::Alex<int,int,alex::AlexCompare,std::allocator<std::pair<int,int>>,true>::TraversalNode,std::allocator<alex::Alex<int,int,alex::AlexCompare,std::allocator<std::pair<int,int>>,true>::TraversalNode>>
              *)&local_78,(iterator)0x0,&local_60);
  pdVar21 = (data_node_type *)this->root_node_;
  local_40 = this;
  if ((pdVar21->super_AlexNode<int,_int>).is_leaf_ == false) {
    local_38 = (double)local_4c;
    pdVar27 = pdVar21;
    do {
      auVar31._8_8_ = 0;
      auVar31._0_8_ = (pdVar27->super_AlexNode<int,_int>).model_.a_;
      auVar30._8_8_ = 0;
      auVar30._0_8_ = local_38;
      auVar5._8_8_ = 0;
      auVar5._0_8_ = (pdVar27->super_AlexNode<int,_int>).model_.b_;
      auVar5 = vfmadd213sd_fma(auVar31,auVar30,auVar5);
      local_48 = auVar5._0_8_;
      uVar28 = *(int *)&pdVar27->allocator_ - 1;
      uVar18 = ~((int)local_48 >> 0x1f) & (int)local_48;
      if ((int)uVar18 <= (int)uVar28) {
        uVar28 = uVar18;
      }
      local_60.node = (model_node_type *)pdVar27;
      local_60.bucketID = uVar28;
      if (iStack_70._M_current == local_68) {
        std::
        vector<alex::Alex<int,int,alex::AlexCompare,std::allocator<std::pair<int,int>>,true>::TraversalNode,std::allocator<alex::Alex<int,int,alex::AlexCompare,std::allocator<std::pair<int,int>>,true>::TraversalNode>>
        ::
        _M_realloc_insert<alex::Alex<int,int,alex::AlexCompare,std::allocator<std::pair<int,int>>,true>::TraversalNode>
                  ((vector<alex::Alex<int,int,alex::AlexCompare,std::allocator<std::pair<int,int>>,true>::TraversalNode,std::allocator<alex::Alex<int,int,alex::AlexCompare,std::allocator<std::pair<int,int>>,true>::TraversalNode>>
                    *)&local_78,iStack_70,&local_60);
      }
      else {
        (iStack_70._M_current)->node = (model_node_type *)pdVar27;
        *(ulong *)&(iStack_70._M_current)->bucketID = CONCAT44(local_60._12_4_,uVar28);
        iStack_70._M_current = iStack_70._M_current + 1;
      }
      iVar13._M_current = iStack_70._M_current;
      pdVar27 = (data_node_type *)
                (&(pdVar27->next_leaf_->super_AlexNode<int,_int>)._vptr_AlexNode)[(int)uVar28];
      bVar29 = (pdVar27->super_AlexNode<int,_int>).is_leaf_;
      pdVar21 = unaff_R12;
      if (bVar29 == true) {
        plVar1 = &(local_40->stats_).num_node_lookups;
        *plVar1 = *plVar1 + (long)(pdVar27->super_AlexNode<int,_int>).level_;
        auVar5 = vcvtdq2pd_avx(ZEXT416((uint)(int)(local_48 + 0.5)));
        auVar10._8_8_ = 0x7fffffffffffffff;
        auVar10._0_8_ = 0x7fffffffffffffff;
        auVar32._8_8_ = 0;
        auVar32._0_8_ = local_48 - auVar5._0_8_;
        auVar30 = vandpd_avx512vl(auVar32,auVar10);
        pdVar21 = pdVar27;
        if (auVar30._0_8_ <= local_48 * 2.220446049250313e-15) {
          if (auVar5._0_8_ <= local_48) {
            psVar8 = pdVar27->prev_leaf_;
            if (psVar8 != (self_type *)0x0) {
              ppsVar16 = &pdVar27->prev_leaf_;
              iVar26 = psVar8->data_capacity_;
              uVar23 = (long)(iVar26 + -1);
              do {
                uVar24 = uVar23;
                if (iVar26 < 1) {
                  iVar26 = -0x80000000;
                  goto LAB_0013f96c;
                }
                iVar26 = iVar26 + -1;
                uVar23 = uVar24 - 1;
              } while ((psVar8->bitmap_[uVar24 >> 6 & 0x3ffffff] >> (uVar24 & 0x3f) & 1) == 0);
              iVar26 = psVar8->key_slots_[uVar24];
LAB_0013f96c:
              if (local_4c <= iVar26) {
                uVar28 = iStack_70._M_current[-1].bucketID;
                uVar18 = (int)uVar28 %
                         (1 << ((pdVar27->super_AlexNode<int,_int>).duplication_factor_ & 0x1f));
                if (uVar28 != uVar18) {
                  iVar26 = uVar28 + ~uVar18;
                  goto LAB_0013fb3e;
                }
                pTVar2 = iStack_70._M_current + -1;
                pmVar14 = pTVar2->node;
                do {
                  pTVar3 = iStack_70._M_current + -1;
                  bVar7 = (pmVar14->super_AlexNode<int,_int>).duplication_factor_;
                  iVar13._M_current[-1].bucketID = iStack_70._M_current[-2].bucketID;
                  pTVar2->node = iStack_70._M_current[-2].node;
                  uVar28 = iVar13._M_current[-1].bucketID;
                  uVar18 = (int)uVar28 % (1 << (bVar7 & 0x1f));
                  pmVar14 = iVar13._M_current[-1].node;
                  iStack_70._M_current = pTVar3;
                } while (uVar28 == uVar18);
                iVar26 = uVar28 + ~uVar18;
                iVar13._M_current[-1].bucketID = iVar26;
                pdVar21 = (data_node_type *)pmVar14->children_[iVar26];
                if ((pdVar21->super_AlexNode<int,_int>).is_leaf_ == false) {
                  do {
                    local_60.bucketID = *(int *)&pdVar21->allocator_ - 1;
                    local_60.node = (model_node_type *)pdVar21;
                    if (iStack_70._M_current == local_68) {
                      std::
                      vector<alex::Alex<int,int,alex::AlexCompare,std::allocator<std::pair<int,int>>,true>::TraversalNode,std::allocator<alex::Alex<int,int,alex::AlexCompare,std::allocator<std::pair<int,int>>,true>::TraversalNode>>
                      ::
                      _M_realloc_insert<alex::Alex<int,int,alex::AlexCompare,std::allocator<std::pair<int,int>>,true>::TraversalNode>
                                ((vector<alex::Alex<int,int,alex::AlexCompare,std::allocator<std::pair<int,int>>,true>::TraversalNode,std::allocator<alex::Alex<int,int,alex::AlexCompare,std::allocator<std::pair<int,int>>,true>::TraversalNode>>
                                  *)&local_78,iStack_70,&local_60);
                    }
                    else {
                      TVar11.bucketID = local_60.bucketID;
                      TVar11.node = (model_node_type *)pdVar21;
                      TVar11._12_4_ = local_60._12_4_;
                      *iStack_70._M_current = TVar11;
                      iStack_70._M_current = iStack_70._M_current + 1;
                    }
                    pdVar21 = *(data_node_type **)
                               ((long)pdVar21->next_leaf_ +
                               (long)*(int *)&pdVar21->allocator_ * 8 + -8);
                  } while ((pdVar21->super_AlexNode<int,_int>).is_leaf_ != true);
                }
                if (pdVar21 == *ppsVar16) goto LAB_0013fb41;
                goto LAB_0013fd3c;
              }
            }
          }
          else {
            psVar8 = pdVar27->next_leaf_;
            if (psVar8 != (self_type *)0x0) {
              iVar26 = 0x7fffffff;
              if (0 < psVar8->data_capacity_) {
                uVar23 = 0;
                do {
                  if ((psVar8->bitmap_[uVar23 >> 6 & 0x3ffffff] >> (uVar23 & 0x3f) & 1) != 0) {
                    iVar26 = psVar8->key_slots_[uVar23];
                    break;
                  }
                  uVar23 = uVar23 + 1;
                } while (psVar8->data_capacity_ != (int)uVar23);
              }
              if (iVar26 <= local_4c) {
                ppsVar16 = &pdVar27->next_leaf_;
                iVar26 = 1 << ((pdVar27->super_AlexNode<int,_int>).duplication_factor_ & 0x1f);
                pmVar14 = iStack_70._M_current[-1].node;
                iVar26 = (iStack_70._M_current[-1].bucketID -
                         iStack_70._M_current[-1].bucketID % iVar26) + iVar26;
                if (iVar26 == pmVar14->num_children_) {
                  pTVar2 = iStack_70._M_current + -1;
                  do {
                    pTVar3 = iStack_70._M_current + -1;
                    iVar26 = 1 << ((pmVar14->super_AlexNode<int,_int>).duplication_factor_ & 0x1f);
                    iVar13._M_current[-1].bucketID = iStack_70._M_current[-2].bucketID;
                    pTVar2->node = iStack_70._M_current[-2].node;
                    pmVar14 = iVar13._M_current[-1].node;
                    iVar26 = (iVar13._M_current[-1].bucketID + iVar26) -
                             iVar13._M_current[-1].bucketID % iVar26;
                    iStack_70._M_current = pTVar3;
                  } while (iVar26 == pmVar14->num_children_);
                  iVar13._M_current[-1].bucketID = iVar26;
                  pdVar21 = (data_node_type *)pmVar14->children_[iVar26];
                  if ((pdVar21->super_AlexNode<int,_int>).is_leaf_ == false) {
                    do {
                      local_60.bucketID = 0;
                      local_60.node = (model_node_type *)pdVar21;
                      if (iStack_70._M_current == local_68) {
                        std::
                        vector<alex::Alex<int,int,alex::AlexCompare,std::allocator<std::pair<int,int>>,true>::TraversalNode,std::allocator<alex::Alex<int,int,alex::AlexCompare,std::allocator<std::pair<int,int>>,true>::TraversalNode>>
                        ::
                        _M_realloc_insert<alex::Alex<int,int,alex::AlexCompare,std::allocator<std::pair<int,int>>,true>::TraversalNode>
                                  ((vector<alex::Alex<int,int,alex::AlexCompare,std::allocator<std::pair<int,int>>,true>::TraversalNode,std::allocator<alex::Alex<int,int,alex::AlexCompare,std::allocator<std::pair<int,int>>,true>::TraversalNode>>
                                    *)&local_78,iStack_70,&local_60);
                      }
                      else {
                        TVar12.bucketID = 0;
                        TVar12.node = (model_node_type *)pdVar21;
                        TVar12._12_4_ = local_60._12_4_;
                        *iStack_70._M_current = TVar12;
                        iStack_70._M_current = iStack_70._M_current + 1;
                      }
                      pdVar21 = (data_node_type *)
                                (pdVar21->next_leaf_->super_AlexNode<int,_int>)._vptr_AlexNode;
                    } while ((pdVar21->super_AlexNode<int,_int>).is_leaf_ != true);
                  }
                  if (pdVar21 != *ppsVar16) goto LAB_0013fc4b;
                }
                else {
LAB_0013fb3e:
                  iStack_70._M_current[-1].bucketID = iVar26;
                }
LAB_0013fb41:
                pdVar21 = *ppsVar16;
              }
            }
          }
        }
      }
      unaff_R12 = pdVar21;
    } while (bVar29 == false);
  }
  this_00 = local_40;
  iVar13._M_current = iStack_70._M_current;
  if (pdVar21 != leaf) {
    if (pdVar21->prev_leaf_ == leaf) {
      uVar28 = iStack_70._M_current[-1].bucketID;
      uVar18 = (int)uVar28 % (1 << ((leaf->super_AlexNode<int,_int>).duplication_factor_ & 0x1f));
      if (uVar28 == uVar18) {
        pTVar2 = iStack_70._M_current + -1;
        pmVar14 = pTVar2->node;
        do {
          pTVar3 = iStack_70._M_current + -1;
          bVar7 = (pmVar14->super_AlexNode<int,_int>).duplication_factor_;
          iVar13._M_current[-1].bucketID = iStack_70._M_current[-2].bucketID;
          pTVar2->node = iStack_70._M_current[-2].node;
          uVar28 = iVar13._M_current[-1].bucketID;
          uVar18 = (int)uVar28 % (1 << (bVar7 & 0x1f));
          pmVar14 = iVar13._M_current[-1].node;
          iStack_70._M_current = pTVar3;
        } while (uVar28 == uVar18);
        iVar26 = uVar28 + ~uVar18;
        iVar13._M_current[-1].bucketID = iVar26;
        pdVar21 = (data_node_type *)pmVar14->children_[iVar26];
        if ((pdVar21->super_AlexNode<int,_int>).is_leaf_ == false) {
          do {
            local_60.bucketID = *(int *)&pdVar21->allocator_ - 1;
            local_60.node = (model_node_type *)pdVar21;
            if (iStack_70._M_current == local_68) {
              std::
              vector<alex::Alex<int,int,alex::AlexCompare,std::allocator<std::pair<int,int>>,true>::TraversalNode,std::allocator<alex::Alex<int,int,alex::AlexCompare,std::allocator<std::pair<int,int>>,true>::TraversalNode>>
              ::
              _M_realloc_insert<alex::Alex<int,int,alex::AlexCompare,std::allocator<std::pair<int,int>>,true>::TraversalNode>
                        ((vector<alex::Alex<int,int,alex::AlexCompare,std::allocator<std::pair<int,int>>,true>::TraversalNode,std::allocator<alex::Alex<int,int,alex::AlexCompare,std::allocator<std::pair<int,int>>,true>::TraversalNode>>
                          *)&local_78,iStack_70,&local_60);
            }
            else {
              (iStack_70._M_current)->node = (model_node_type *)pdVar21;
              *(ulong *)&(iStack_70._M_current)->bucketID =
                   CONCAT44(local_60._12_4_,local_60.bucketID);
              iStack_70._M_current = iStack_70._M_current + 1;
            }
            pdVar21 = *(data_node_type **)
                       ((long)pdVar21->next_leaf_ + (long)*(int *)&pdVar21->allocator_ * 8 + -8);
          } while ((pdVar21->super_AlexNode<int,_int>).is_leaf_ != true);
        }
        if (pdVar21 != leaf->prev_leaf_) {
LAB_0013fd3c:
          __assert_fail("cur == leaf->prev_leaf_",
                        "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]ALEX/src/core/alex.h"
                        ,0x1fc,
                        "void alex::Alex<int, int>::correct_traversal_path(data_node_type *, std::vector<TraversalNode> &, bool) const [T = int, P = int, Compare = alex::AlexCompare, Alloc = std::allocator<std::pair<int, int>>, allow_duplicates = true]"
                       );
        }
        goto LAB_0013fd62;
      }
      iVar26 = uVar28 + ~uVar18;
    }
    else {
      if (pdVar21->next_leaf_ != leaf) {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]ALEX/src/core/alex.h"
                      ,0x8ca,
                      "void alex::Alex<int, int>::merge(data_node_type *, T) [T = int, P = int, Compare = alex::AlexCompare, Alloc = std::allocator<std::pair<int, int>>, allow_duplicates = true]"
                     );
      }
      iVar26 = 1 << ((leaf->super_AlexNode<int,_int>).duplication_factor_ & 0x1f);
      pmVar14 = iStack_70._M_current[-1].node;
      iVar26 = (iStack_70._M_current[-1].bucketID - iStack_70._M_current[-1].bucketID % iVar26) +
               iVar26;
      if (iVar26 == pmVar14->num_children_) {
        pTVar2 = iStack_70._M_current + -1;
        do {
          pTVar3 = iStack_70._M_current + -1;
          iVar26 = 1 << ((pmVar14->super_AlexNode<int,_int>).duplication_factor_ & 0x1f);
          iVar13._M_current[-1].bucketID = iStack_70._M_current[-2].bucketID;
          pTVar2->node = iStack_70._M_current[-2].node;
          pmVar14 = iVar13._M_current[-1].node;
          iVar26 = (iVar13._M_current[-1].bucketID + iVar26) -
                   iVar13._M_current[-1].bucketID % iVar26;
          iStack_70._M_current = pTVar3;
        } while (iVar26 == pmVar14->num_children_);
        iVar13._M_current[-1].bucketID = iVar26;
        pdVar21 = (data_node_type *)pmVar14->children_[iVar26];
        if ((pdVar21->super_AlexNode<int,_int>).is_leaf_ == false) {
          do {
            local_60.bucketID = 0;
            local_60.node = (model_node_type *)pdVar21;
            if (iStack_70._M_current == local_68) {
              std::
              vector<alex::Alex<int,int,alex::AlexCompare,std::allocator<std::pair<int,int>>,true>::TraversalNode,std::allocator<alex::Alex<int,int,alex::AlexCompare,std::allocator<std::pair<int,int>>,true>::TraversalNode>>
              ::
              _M_realloc_insert<alex::Alex<int,int,alex::AlexCompare,std::allocator<std::pair<int,int>>,true>::TraversalNode>
                        ((vector<alex::Alex<int,int,alex::AlexCompare,std::allocator<std::pair<int,int>>,true>::TraversalNode,std::allocator<alex::Alex<int,int,alex::AlexCompare,std::allocator<std::pair<int,int>>,true>::TraversalNode>>
                          *)&local_78,iStack_70,&local_60);
            }
            else {
              (iStack_70._M_current)->node = (model_node_type *)pdVar21;
              *(ulong *)&(iStack_70._M_current)->bucketID = (ulong)(uint)local_60._12_4_ << 0x20;
              iStack_70._M_current = iStack_70._M_current + 1;
            }
            pdVar21 = (data_node_type *)
                      (pdVar21->next_leaf_->super_AlexNode<int,_int>)._vptr_AlexNode;
          } while ((pdVar21->super_AlexNode<int,_int>).is_leaf_ != true);
        }
        if (pdVar21 != leaf->next_leaf_) {
LAB_0013fc4b:
          __assert_fail("cur == leaf->next_leaf_",
                        "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]ALEX/src/core/alex.h"
                        ,0x217,
                        "void alex::Alex<int, int>::correct_traversal_path(data_node_type *, std::vector<TraversalNode> &, bool) const [T = int, P = int, Compare = alex::AlexCompare, Alloc = std::allocator<std::pair<int, int>>, allow_duplicates = true]"
                       );
        }
        goto LAB_0013fd62;
      }
    }
    iStack_70._M_current[-1].bucketID = iVar26;
  }
LAB_0013fd62:
  if ((long)iStack_70._M_current - (long)local_78 != 0x10) {
    iVar26 = (int)((ulong)((long)iStack_70._M_current - (long)local_78) >> 4);
    local_48 = (double)(ulong)(iVar26 - 1);
    lVar15 = (long)iVar26 * 0x10;
    iVar26 = *(int *)(lVar15 + -8 + (long)local_78);
    iVar22 = 1 << ((leaf->super_AlexNode<int,_int>).duplication_factor_ & 0x1f);
    node_00 = *(AlexNode<int,_int> **)(lVar15 + -0x10 + (long)local_78);
    do {
      pdVar21 = leaf;
      if (local_48._0_4_ < 0) break;
      do {
        leaf = pdVar21;
        if ((pdVar21->num_keys_ != 0) ||
           (iVar19._0_1_ = node_00[1].is_leaf_, iVar19._1_1_ = node_00[1].duplication_factor_,
           iVar19._2_2_ = node_00[1].level_, iVar19 <= iVar22)) break;
        iVar19 = iVar26 % iVar22;
        iVar25 = iVar26 - iVar19;
        iVar20 = iVar26 % (iVar22 * 2);
        if (iVar20 == iVar19) {
          leaf = *(data_node_type **)((long)node_00[1].model_.a_ + (long)(iVar25 + iVar22) * 8);
          if ((leaf->super_AlexNode<int,_int>).is_leaf_ == false) goto LAB_0013fe41;
LAB_0013fe03:
          uVar6 = (leaf->super_AlexNode<int,_int>).duplication_factor_;
          if ((pdVar21->super_AlexNode<int,_int>).duplication_factor_ != uVar6) goto LAB_0013fe41;
          if (0 < iVar22) {
            lVar15 = (long)iVar25;
            do {
              *(data_node_type **)((long)node_00[1].model_.a_ + lVar15 * 8) = leaf;
              lVar15 = lVar15 + 1;
            } while (lVar15 < iVar25 + iVar22);
          }
          if (iVar20 == iVar19) {
            leaf->prev_leaf_ = pdVar21->prev_leaf_;
            if (pdVar21->prev_leaf_ != (self_type *)0x0) {
              ppsVar16 = &pdVar21->prev_leaf_->next_leaf_;
LAB_0013fe5a:
              *ppsVar16 = leaf;
            }
          }
          else {
            leaf->next_leaf_ = pdVar21->next_leaf_;
            if (pdVar21->next_leaf_ != (self_type *)0x0) {
              ppsVar16 = &pdVar21->next_leaf_->prev_leaf_;
              goto LAB_0013fe5a;
            }
          }
          (leaf->super_AlexNode<int,_int>).duplication_factor_ = uVar6 + '\x01';
          delete_node(this_00,&pdVar21->super_AlexNode<int,_int>);
          piVar4 = &(this_00->stats_).num_data_nodes;
          *piVar4 = *piVar4 + -1;
          iVar22 = 1 << ((leaf->super_AlexNode<int,_int>).duplication_factor_ & 0x1f);
          bVar29 = true;
        }
        else {
          leaf = *(data_node_type **)((long)node_00[1].model_.a_ + -8 + (long)iVar25 * 8);
          if ((leaf->super_AlexNode<int,_int>).is_leaf_ == true) goto LAB_0013fe03;
LAB_0013fe41:
          bVar29 = false;
          leaf = pdVar21;
        }
        pdVar21 = leaf;
      } while (bVar29);
      iVar20._0_1_ = node_00[1].is_leaf_;
      iVar20._1_1_ = node_00[1].duplication_factor_;
      iVar20._2_2_ = node_00[1].level_;
      if (iVar22 != iVar20) break;
      bVar7 = node_00->duplication_factor_;
      (leaf->super_AlexNode<int,_int>).duplication_factor_ = bVar7;
      pAVar9 = this_00->root_node_;
      delete_node(this_00,node_00);
      iVar22 = 1 << (bVar7 & 0x1f);
      piVar4 = &(this_00->stats_).num_model_nodes;
      *piVar4 = *piVar4 + -1;
      if (node_00 == pAVar9) {
        this_00->root_node_ = &leaf->super_AlexNode<int,_int>;
        *this_00->superroot_->children_ = &leaf->super_AlexNode<int,_int>;
        (this_00->superroot_->super_AlexNode<int,_int>).level_ = this_00->root_node_->level_ + -1;
        pAVar17 = node_00;
      }
      else {
        iVar26 = SUB84(local_48,0);
        local_48 = (double)(ulong)(iVar26 - 1);
        lVar15 = (long)iVar26 * 0x10;
        pAVar17 = *(AlexNode<int,_int> **)(lVar15 + -0x10 + (long)local_78);
        iVar26 = *(int *)(lVar15 + -8 + (long)local_78);
        this_00 = local_40;
        if (bVar7 != 0x1f) {
          iVar19 = iVar26 - iVar26 % iVar22;
          lVar15 = (long)iVar19;
          do {
            *(data_node_type **)((long)pAVar17[1].model_.a_ + lVar15 * 8) = leaf;
            lVar15 = lVar15 + 1;
          } while (lVar15 < iVar19 + iVar22);
        }
      }
      bVar29 = node_00 != pAVar9;
      node_00 = pAVar17;
    } while (bVar29);
  }
  if (local_78 != (void *)0x0) {
    operator_delete(local_78,(long)local_68 - (long)local_78);
  }
  return;
}

Assistant:

void merge(data_node_type* leaf, T key) {
    // first save the complete path down to data node
    std::vector<TraversalNode> traversal_path;
    auto leaf_dup = get_leaf(key, &traversal_path);
    // We might need to correct the traversal path in edge cases
    if (leaf_dup != leaf) {
      if (leaf_dup->prev_leaf_ == leaf) {
        correct_traversal_path(leaf, traversal_path, true);
      } else if (leaf_dup->next_leaf_ == leaf) {
        correct_traversal_path(leaf, traversal_path, false);
      } else {
        assert(false);
        return;
      }
    }
    if (traversal_path.size() == 1) {
      return;
    }
    int path_pos = static_cast<int>(traversal_path.size()) - 1;
    TraversalNode tn = traversal_path[path_pos];
    model_node_type* parent = tn.node;
    int bucketID = tn.bucketID;
    int repeats = 1 << leaf->duplication_factor_;

    while (path_pos >= 0) {
      // repeatedly merge leaf with "sibling" leaf by redirecting pointers in
      // the parent
      while (leaf->num_keys_ == 0 && repeats < parent->num_children_) {
        int start_bucketID = bucketID - (bucketID % repeats);
        int end_bucketID = start_bucketID + repeats;
        // determine if the potential sibling leaf is adjacent to the right or
        // left
        bool adjacent_to_right =
            (bucketID % (repeats << 1) == bucketID % repeats);
        data_node_type* adjacent_leaf = nullptr;

        // check if adjacent node is a leaf
        if (adjacent_to_right && parent->children_[end_bucketID]->is_leaf_) {
          adjacent_leaf =
              static_cast<data_node_type*>(parent->children_[end_bucketID]);
        } else if (!adjacent_to_right &&
                   parent->children_[start_bucketID - 1]->is_leaf_) {
          adjacent_leaf = static_cast<data_node_type*>(
              parent->children_[start_bucketID - 1]);
        } else {
          break;  // unable to merge with sibling leaf
        }

        // check if adjacent node is a sibling
        if (leaf->duplication_factor_ != adjacent_leaf->duplication_factor_) {
          break;  // unable to merge with sibling leaf
        }

        // merge with adjacent leaf
        for (int i = start_bucketID; i < end_bucketID; i++) {
          parent->children_[i] = adjacent_leaf;
        }
        if (adjacent_to_right) {
          adjacent_leaf->prev_leaf_ = leaf->prev_leaf_;
          if (leaf->prev_leaf_) {
            leaf->prev_leaf_->next_leaf_ = adjacent_leaf;
          }
        } else {
          adjacent_leaf->next_leaf_ = leaf->next_leaf_;
          if (leaf->next_leaf_) {
            leaf->next_leaf_->prev_leaf_ = adjacent_leaf;
          }
        }
        adjacent_leaf->duplication_factor_++;
        delete_node(leaf);
        stats_.num_data_nodes--;
        leaf = adjacent_leaf;
        repeats = 1 << leaf->duplication_factor_;
      }

      // try to merge up by removing parent and replacing pointers to parent
      // with pointers to leaf in grandparent
      if (repeats == parent->num_children_) {
        leaf->duplication_factor_ = parent->duplication_factor_;
        repeats = 1 << leaf->duplication_factor_;
        bool is_root_node = (parent == root_node_);
        delete_node(parent);
        stats_.num_model_nodes--;

        if (is_root_node) {
          root_node_ = leaf;
          update_superroot_pointer();
          break;
        }

        path_pos--;
        tn = traversal_path[path_pos];
        parent = tn.node;
        bucketID = tn.bucketID;
        int start_bucketID = bucketID - (bucketID % repeats);
        int end_bucketID = start_bucketID + repeats;
        for (int i = start_bucketID; i < end_bucketID; i++) {
          parent->children_[i] = leaf;
        }
      } else {
        break;  // unable to merge up
      }
    }
  }